

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O2

void encode_superblock(AV1_COMP *cpi,TileDataEnc *tile_data,ThreadData_conflict *td,TokenExtra **t,
                      RUN_TYPE dry_run,BLOCK_SIZE bsize,int *rate)

{
  AV1_COMMON *cm;
  MACROBLOCKD *xd_00;
  uint *puVar1;
  MV_REFERENCE_FRAME ref1;
  _Bool _Var2;
  _Bool _Var3;
  int iVar4;
  int mi_row;
  int mi_col;
  MB_MODE_INFO *pMVar5;
  MB_MODE_INFO *pMVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  TX_SIZE TVar11;
  byte bVar12;
  byte bVar13;
  uint uVar14;
  YV12_BUFFER_CONFIG *src;
  ulong uVar15;
  TX_SIZE_SEARCH_METHOD TVar16;
  TX_MODE TVar17;
  byte bVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  SequenceHeader *pSVar22;
  byte bVar23;
  ThreadData_conflict *pTVar24;
  MB_MODE_INFO **ppMVar25;
  int idy;
  int iVar26;
  int iVar27;
  byte bVar28;
  char val;
  ThreadData_conflict *pTVar29;
  byte bVar30;
  ThreadData_conflict *pTVar31;
  byte bVar32;
  uint8_t uVar33;
  MACROBLOCKD *xd;
  int plane;
  long lVar34;
  int idx;
  int iVar35;
  bool bVar36;
  bool bVar37;
  short sVar38;
  short sVar42;
  short sVar43;
  short sVar44;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined8 uVar46;
  MB_MODE_INFO *mbmi;
  int mi_height;
  int mi_width;
  
  uVar33 = ((cpi->common).seq_params)->monochrome;
  ppMVar25 = (td->mb).e_mbd.mi;
  pMVar5 = *ppMVar25;
  if ((cpi->common).seg.enabled == '\0') {
    bVar28 = 0;
  }
  else {
    bVar28 = ((byte)(cpi->common).seg.feature_mask[*(ushort *)&pMVar5->field_0xa7 & 7] & 0x40) >> 6;
  }
  bVar37 = true;
  if (-1 < (char)*(ushort *)&pMVar5->field_0xa7) {
    bVar37 = '\0' < pMVar5->ref_frame[0];
  }
  iVar4 = (cpi->common).mi_params.mi_stride;
  bVar12 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
  uVar14 = (uint)bVar12;
  bVar13 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bsize];
  uVar21 = (uint)bVar13;
  TVar16 = (cpi->winner_mode_params).tx_size_search_methods[0];
  iVar26 = (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch;
  (td->mb).txfm_search_params.tx_size_search_method = TVar16;
  if (iVar26 != 0) {
    TVar16 = (cpi->winner_mode_params).tx_size_search_methods[2];
    (td->mb).txfm_search_params.tx_size_search_method = TVar16;
  }
  cm = &cpi->common;
  iVar26 = (uint)(uVar33 == '\0') * 2 + 1;
  xd_00 = &(td->mb).e_mbd;
  TVar17 = '\x02' - (TVar16 == '\x02');
  uVar19 = 0;
  if ((cpi->common).features.coded_lossless != false) {
    TVar17 = '\0';
  }
  (td->mb).txfm_search_params.tx_mode_search_type = TVar17;
  mi_row = (td->mb).e_mbd.mi_row;
  mi_col = (td->mb).e_mbd.mi_col;
  pTVar29 = td;
  if (bVar37 == false) {
    if (uVar33 == '\0') {
      if ((td->mb).e_mbd.is_chroma_ref == true) {
        if (((pMVar5->field_0xa7 & 0x80) == 0) && (pMVar5->ref_frame[0] < '\x01')) {
          uVar19 = (uint)(pMVar5->uv_mode == '\r');
        }
      }
      else {
        uVar19 = 1;
      }
    }
    (td->mb).e_mbd.cfl.store_y = uVar19;
    pMVar5->skip_txfm = '\x01';
    for (iVar27 = 0; iVar26 != iVar27; iVar27 = iVar27 + 1) {
      av1_encode_intra_block_plane
                (cpi,&td->mb,bsize,iVar27,dry_run,
                 cpi->optimize_seg_arr[*(ushort *)&pMVar5->field_0xa7 & 7]);
    }
    if ((((cpi->common).seg.segid_preskip == '\0') && ((cpi->common).seg.update_map != '\0')) &&
       ((cpi->enc_seg).has_lossless_segment == true)) {
      pMVar5->skip_txfm = '\0';
    }
    (td->mb).e_mbd.cfl.store_y = 0;
    if (((cpi->common).features.allow_screen_content_tools != false) &&
       ((BLOCK_128X128 < bsize || ((0xe007U >> (bsize & 0x1f) & 1) == 0)))) {
      for (lVar34 = 0; (ulong)(uVar33 == '\0') + 1 != lVar34; lVar34 = lVar34 + 1) {
        if ((dry_run == '\0') && ((pMVar5->palette_mode_info).palette_size[lVar34] != '\0')) {
          av1_tokenize_color_map
                    (&td->mb,(int)lVar34,t,bsize,pMVar5->tx_size,'\0',
                     (uint)tile_data->allow_update_cdf,td->counts);
        }
      }
    }
    av1_update_intra_mb_txb_context(cpi,td,dry_run,bsize,tile_data->allow_update_cdf);
  }
  else {
    ref1 = pMVar5->ref_frame[1];
    set_ref_ptrs(cm,xd_00,pMVar5->ref_frame[0],ref1);
    for (lVar34 = 0; (ulong)('\0' < ref1) + 1 != lVar34; lVar34 = lVar34 + 1) {
      src = get_ref_frame_yv12_buf(cm,pMVar5->ref_frame[lVar34]);
      av1_setup_pre_planes
                (xd_00,(int)lVar34,src,mi_row,mi_col,(td->mb).e_mbd.block_ref_scale_factors[lVar34],
                 iVar26);
    }
    if ((td->mb).reuse_inter_pred == false) {
      pSVar22 = (cpi->common).seq_params;
      uVar19 = 0;
    }
    else {
      uVar19 = 0;
      pSVar22 = (cpi->common).seq_params;
      if ((cpi->sf).rt_sf.nonrd_check_partition_split == 0) {
        uVar19 = (uint)(pSVar22->bit_depth == AOM_BITS_8);
      }
    }
    av1_enc_build_inter_predictor
              (cm,xd_00,mi_row,mi_col,(BUFFER_SET *)0x0,bsize,uVar19,
               (uint)(pSVar22->monochrome == '\0') * 2);
    if (pMVar5->motion_mode == '\x01') {
      av1_build_obmc_inter_predictors_sb(cm,xd_00);
    }
    av1_encode_sb(cpi,&td->mb,bsize,dry_run);
    av1_tokenize_sb_vartx(cpi,td,dry_run,bsize,(int *)0x0,tile_data->allow_update_cdf);
  }
  if (dry_run == '\0') {
    if ((((((cm->current_frame).frame_type & 0xfd) == 0) &&
         ((cpi->common).features.allow_screen_content_tools == true)) &&
        ((cpi->common).features.allow_intrabc != false)) && ((pMVar5->field_0xa7 & 0x80) != 0)) {
      td->intrabc_used = 1;
    }
    TVar17 = (td->mb).txfm_search_params.tx_mode_search_type;
    pTVar29 = (ThreadData_conflict *)CONCAT71((int7)((ulong)pTVar29 >> 8),bVar37);
    if (((TVar17 == '\x02') &&
        (uVar19 = *(ushort *)&pMVar5->field_0xa7 & 7, (td->mb).e_mbd.lossless[uVar19] == 0)) &&
       (pMVar5->bsize != BLOCK_4X4)) {
      if (bVar37 == false) {
        bVar23 = pMVar5->tx_size;
        bVar18 = ""[bsize];
        if (bVar23 != bVar18) {
          puVar1 = &(td->mb).txfm_search_info.txb_split_count;
          *puVar1 = *puVar1 + 1;
        }
        if (bsize != BLOCK_4X4) {
          _Var2 = (td->mb).e_mbd.up_available;
          _Var3 = (td->mb).e_mbd.left_available;
          bVar30 = *(td->mb).e_mbd.above_txfm_context;
          if ((_Var2 == true) &&
             ((pMVar6 = (td->mb).e_mbd.above_mbmi, (pMVar6->field_0xa7 & 0x80) != 0 ||
              ('\0' < pMVar6->ref_frame[0])))) {
            bVar30 = block_size_wide[pMVar6->bsize];
          }
          bVar32 = *(td->mb).e_mbd.left_txfm_context;
          if ((_Var3 != false) &&
             ((pMVar6 = (td->mb).e_mbd.left_mbmi, (pMVar6->field_0xa7 & 0x80) != 0 ||
              ('\0' < pMVar6->ref_frame[0])))) {
            bVar32 = block_size_high[pMVar6->bsize];
          }
          pTVar29 = (ThreadData_conflict *)0x0;
          for (; val = (char)pTVar29, bVar18 != bVar23; bVar18 = ""[bVar18]) {
            pTVar29 = (ThreadData_conflict *)(ulong)(byte)(val + 1);
          }
          if (tile_data->allow_update_cdf != '\0') {
            pTVar29 = (ThreadData_conflict *)(ulong)(uint)(int)val;
            update_cdf(((td->mb).e_mbd.tile_ctx)->tx_size_cdf
                       [(ulong)(byte)bsize_to_tx_size_cat_bsize_to_tx_size_depth_table[bsize] - 1]
                       [(uint)(byte)(_Var3 & tx_size_high[""[(*(td->mb).e_mbd.mi)->bsize]] <=
                                             (int)(uint)bVar32) +
                        (uint)(byte)(_Var2 & tx_size_wide[""[(*(td->mb).e_mbd.mi)->bsize]] <=
                                             (int)(uint)bVar30)],val,
                       (byte)bsize_to_max_depth_bsize_to_max_depth_table[bsize] + 1);
          }
        }
      }
      else {
        bVar36 = pMVar5->skip_txfm != '\0';
        if (bVar36 || bVar28 != 0) goto LAB_001c6408;
        bVar23 = tile_data->allow_update_cdf;
        uVar46 = 0x1c649b;
        uVar19 = get_vartx_max_txsize
                           (xd_00,bsize,(int)CONCAT71((int7)((ulong)pMVar5 >> 8),bVar36 | bVar28));
        iVar4 = tx_size_high_unit[uVar19];
        iVar26 = tx_size_wide_unit[uVar19];
        pTVar29 = (ThreadData_conflict *)
                  ((cpi->common).above_contexts.txfm[(td->mb).e_mbd.tile.tile_row] +
                  (td->mb).e_mbd.mi_col);
        (td->mb).e_mbd.above_txfm_context = (TXFM_CONTEXT *)pTVar29;
        (td->mb).e_mbd.left_txfm_context =
             (td->mb).e_mbd.left_txfm_context_buffer + ((td->mb).e_mbd.mi_row & 0x1f);
        for (iVar27 = 0; iVar27 < (int)uVar21; iVar27 = iVar27 + iVar4) {
          for (iVar35 = 0; iVar35 < (int)uVar14; iVar35 = iVar35 + iVar26) {
            pTVar29 = (ThreadData_conflict *)xd_00;
            update_txfm_count(&td->mb,xd_00,(FRAME_COUNTS *)(ulong)(uVar19 & 0xff),'\0',iVar27,
                              iVar35,(uint)bVar23,(uint8_t)uVar46);
          }
        }
      }
    }
    else {
      if (bVar37 == false) {
        TVar11 = pMVar5->tx_size;
      }
      else {
        uVar19 = *(ushort *)&pMVar5->field_0xa7 & 7;
LAB_001c6408:
        if ((td->mb).e_mbd.lossless[uVar19] == 0) {
          TVar11 = tx_size_from_tx_mode(bsize,TVar17);
        }
        else {
          TVar11 = '\0';
        }
      }
      uVar19 = (cpi->common).mi_params.mi_cols - mi_col;
      if ((int)uVar14 <= (int)uVar19) {
        uVar19 = uVar14;
      }
      uVar20 = (cpi->common).mi_params.mi_rows - mi_row;
      if ((int)uVar21 <= (int)uVar20) {
        uVar20 = uVar21;
      }
      pTVar29 = (ThreadData_conflict *)0x0;
      pTVar24 = (ThreadData_conflict *)(ulong)uVar19;
      if ((int)uVar19 < 1) {
        pTVar24 = pTVar29;
      }
      if ((int)uVar20 < 1) {
        uVar20 = 0;
      }
      for (; pTVar29 != (ThreadData_conflict *)(ulong)uVar20;
          pTVar29 = (ThreadData_conflict *)((long)&(pTVar29->mb).plane[0].src_diff + 1)) {
        for (pTVar31 = (ThreadData_conflict *)0x0; pTVar24 != pTVar31;
            pTVar31 = (ThreadData_conflict *)((long)&(pTVar31->mb).plane[0].src_diff + 1)) {
          ppMVar25[(long)pTVar31]->tx_size = TVar11;
        }
        ppMVar25 = ppMVar25 + iVar4;
      }
      if (TVar11 != ""[bsize]) {
        puVar1 = &(td->mb).txfm_search_info.txb_split_count;
        *puVar1 = *puVar1 + 1;
      }
    }
  }
  TVar17 = (td->mb).txfm_search_params.tx_mode_search_type;
  if ((TVar17 == '\x02') &&
     (uVar15 = CONCAT71((int7)((ulong)pTVar29 >> 8),bVar37) & 0xffffffff,
     bVar23 = (byte)uVar15 ^ 1 | pMVar5->bsize == BLOCK_4X4, bVar23 == 0)) {
    if ((pMVar5->skip_txfm != '\0' || bVar28 != 0) ||
       ((td->mb).e_mbd.lossless[*(ushort *)&pMVar5->field_0xa7 & 7] != 0)) {
LAB_001c66e5:
      if ((td->mb).e_mbd.lossless[*(ushort *)&pMVar5->field_0xa7 & 7] == 0) {
        TVar11 = tx_size_from_tx_mode(bsize,TVar17);
      }
      else {
        TVar11 = '\0';
      }
      goto LAB_001c671f;
    }
    if (dry_run != '\0') {
      uVar19 = get_vartx_max_txsize(xd_00,bsize,(int)CONCAT71((int7)(uVar15 >> 8),bVar23));
      iVar4 = tx_size_high_unit[uVar19];
      iVar26 = tx_size_wide_unit[uVar19];
      (td->mb).e_mbd.above_txfm_context =
           (cpi->common).above_contexts.txfm[(td->mb).e_mbd.tile.tile_row] + (td->mb).e_mbd.mi_col;
      (td->mb).e_mbd.left_txfm_context =
           (td->mb).e_mbd.left_txfm_context_buffer + ((td->mb).e_mbd.mi_row & 0x1f);
      for (iVar27 = 0; iVar27 < (int)uVar21; iVar27 = iVar27 + iVar4) {
        for (iVar35 = 0; iVar35 < (int)uVar14; iVar35 = iVar35 + iVar26) {
          set_txfm_context(xd_00,(TX_SIZE)uVar19,iVar27,iVar35);
        }
      }
    }
  }
  else {
    if (bVar37 != false) goto LAB_001c66e5;
    TVar11 = pMVar5->tx_size;
    if (bsize == BLOCK_4X4) {
      TVar11 = '\0';
    }
LAB_001c671f:
    pMVar5->tx_size = TVar11;
    uVar14 = 0;
    if (pMVar5->skip_txfm != '\0' || bVar28 != 0) {
      if ((pMVar5->field_0xa7 & 0x80) == 0) {
        uVar14 = (uint)('\0' < pMVar5->ref_frame[0]);
      }
      else {
        uVar14 = 1;
      }
    }
    set_txfm_ctxs(TVar11,(uint)(td->mb).e_mbd.width,(uint)(td->mb).e_mbd.height,uVar14,xd_00);
  }
  if ((((pMVar5->field_0xa7 & 0x80) != 0) || ('\0' < pMVar5->ref_frame[0])) &&
     ((td->mb).e_mbd.is_chroma_ref == false)) {
    pMVar6 = *(td->mb).e_mbd.mi;
    uVar15 = (ulong)pMVar6->bsize;
    if ((td->mb).e_mbd.lossless[*(ushort *)&pMVar6->field_0xa7 & 7] == 0) {
      bVar37 = (0x2f0bffUL >> (uVar15 & 0x3f) & 1) != 0;
      if ((0x1f07ffUL >> (uVar15 & 0x3f) & 1) == 0) goto LAB_001c6806;
    }
    else {
      bVar37 = av1_ss_size_lookup[uVar15][(td->mb).e_mbd.plane[1].subsampling_x]
               [(td->mb).e_mbd.plane[1].subsampling_y] == BLOCK_4X4;
    }
    if (bVar37) {
      cfl_store_block(xd_00,pMVar5->bsize,pMVar5->tx_size);
    }
  }
LAB_001c6806:
  if (((((dry_run == '\0') && ((cpi->oxcf).pass == AOM_RC_ONE_PASS)) &&
       (((cpi->svc).temporal_layer_id == 0 && ((cpi->sf).rt_sf.use_temporal_noise_estimate != 0))))
      && ((cpi->ppi->use_svc == 0 ||
          ((((cpi->svc).layer_context)->is_key_frame == 0 &&
           ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1)))))) &&
     ((pMVar5->ref_frame[0] == '\x01' && ((*(ushort *)&pMVar5->field_0xa7 & 7) < 3)))) {
    bVar12 = bVar12 >> 1;
    bVar13 = bVar13 >> 1;
    iVar4 = (cpi->common).mi_params.mi_cols;
    uVar14 = iVar4 - mi_col >> 1;
    if ((int)(uint)bVar12 <= (int)uVar14) {
      uVar14 = (uint)bVar12;
    }
    uVar21 = (cpi->common).mi_params.mi_rows - mi_row >> 1;
    if ((int)(uint)bVar13 <= (int)uVar21) {
      uVar21 = (uint)bVar13;
    }
    uVar15 = *(ulong *)pMVar5->mv;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar15;
    sVar38 = (short)uVar15;
    sVar7 = -sVar38;
    sVar42 = (short)(uVar15 >> 0x10);
    sVar8 = -sVar42;
    sVar43 = (short)(uVar15 >> 0x20);
    sVar9 = -sVar43;
    sVar44 = (short)(uVar15 >> 0x30);
    sVar10 = -sVar44;
    auVar45._0_2_ = (ushort)(sVar7 < sVar38) * sVar38 | (ushort)(sVar7 >= sVar38) * sVar7;
    auVar45._2_2_ = (ushort)(sVar8 < sVar42) * sVar42 | (ushort)(sVar8 >= sVar42) * sVar8;
    auVar45._4_2_ = (ushort)(sVar9 < sVar43) * sVar43 | (ushort)(sVar9 >= sVar43) * sVar9;
    auVar45._6_2_ = (ushort)(sVar10 < sVar44) * sVar44 | (ushort)(sVar10 >= sVar44) * sVar10;
    auVar45._8_8_ = 0;
    auVar39 = pshuflw(auVar39,auVar45,0x50);
    auVar40._0_4_ = auVar39._0_4_;
    auVar40._4_4_ = auVar40._0_4_;
    auVar40._8_4_ = auVar39._4_4_;
    auVar40._12_4_ = auVar39._4_4_;
    auVar40 = auVar40 ^ _DAT_0042e5a0;
    auVar41._0_2_ = -(ushort)(-0x7ff7 < auVar40._0_2_);
    auVar41._2_2_ = -(ushort)(-0x7ff7 < auVar40._2_2_);
    auVar41._4_2_ = -(ushort)(-0x7ff7 < auVar40._4_2_);
    auVar41._6_2_ = -(ushort)(-0x7ff7 < auVar40._6_2_);
    auVar41._8_2_ = -(ushort)(-0x7ff7 < auVar40._8_2_);
    auVar41._10_2_ = -(ushort)(-0x7ff7 < auVar40._10_2_);
    auVar41._12_2_ = -(ushort)(-0x7ff7 < auVar40._12_2_);
    auVar41._14_2_ = -(ushort)(-0x7ff7 < auVar40._14_2_);
    iVar26 = movmskpd((uint)bVar13,auVar41);
    uVar19 = 0;
    if ((int)uVar14 < 1) {
      uVar14 = uVar19;
    }
    if ((int)uVar21 < 1) {
      uVar21 = uVar19;
    }
    for (; iVar27 = (mi_col >> 1) + (iVar4 >> 1) * (mi_row >> 1), uVar20 = uVar14, uVar19 != uVar21;
        uVar19 = uVar19 + 1) {
      while (uVar20 != 0) {
        iVar35 = ((cpi->common).mi_params.mi_cols >> 1) * uVar19 + iVar27;
        if (iVar26 == 0) {
          uVar33 = cpi->consec_zero_mv[iVar35];
          if (uVar33 != 0xff) {
            uVar33 = uVar33 + '\x01';
            goto LAB_001c6950;
          }
        }
        else {
          uVar33 = '\0';
LAB_001c6950:
          cpi->consec_zero_mv[iVar35] = uVar33;
        }
        iVar27 = iVar27 + 1;
        uVar20 = uVar20 - 1;
      }
    }
  }
  return;
}

Assistant:

static void encode_superblock(const AV1_COMP *const cpi, TileDataEnc *tile_data,
                              ThreadData *td, TokenExtra **t, RUN_TYPE dry_run,
                              BLOCK_SIZE bsize, int *rate) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO **mi_4x4 = xd->mi;
  MB_MODE_INFO *mbmi = mi_4x4[0];
  const int seg_skip =
      segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP);
  const int mis = cm->mi_params.mi_stride;
  const int mi_width = mi_size_wide[bsize];
  const int mi_height = mi_size_high[bsize];
  const int is_inter = is_inter_block(mbmi);

  // Initialize tx_mode and tx_size_search_method
  TxfmSearchParams *txfm_params = &x->txfm_search_params;
  set_tx_size_search_method(
      cm, &cpi->winner_mode_params, txfm_params,
      cpi->sf.winner_mode_sf.enable_winner_mode_for_tx_size_srch, 1);

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  if (!is_inter) {
    xd->cfl.store_y = store_cfl_required(cm, xd);
    mbmi->skip_txfm = 1;
    for (int plane = 0; plane < num_planes; ++plane) {
      av1_encode_intra_block_plane(cpi, x, bsize, plane, dry_run,
                                   cpi->optimize_seg_arr[mbmi->segment_id]);
    }

    // If there is at least one lossless segment, force the skip for intra
    // block to be 0, in order to avoid the segment_id to be changed by in
    // write_segment_id().
    if (!cpi->common.seg.segid_preskip && cpi->common.seg.update_map &&
        cpi->enc_seg.has_lossless_segment)
      mbmi->skip_txfm = 0;

    xd->cfl.store_y = 0;
    if (av1_allow_palette(cm->features.allow_screen_content_tools, bsize)) {
      for (int plane = 0; plane < AOMMIN(2, num_planes); ++plane) {
        if (mbmi->palette_mode_info.palette_size[plane] > 0) {
          if (!dry_run) {
            av1_tokenize_color_map(x, plane, t, bsize, mbmi->tx_size,
                                   PALETTE_MAP, tile_data->allow_update_cdf,
                                   td->counts);
          } else if (dry_run == DRY_RUN_COSTCOEFFS) {
            *rate +=
                av1_cost_color_map(x, plane, bsize, mbmi->tx_size, PALETTE_MAP);
          }
        }
      }
    }

    av1_update_intra_mb_txb_context(cpi, td, dry_run, bsize,
                                    tile_data->allow_update_cdf);
  } else {
    int ref;
    const int is_compound = has_second_ref(mbmi);

    set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
    for (ref = 0; ref < 1 + is_compound; ++ref) {
      const YV12_BUFFER_CONFIG *cfg =
          get_ref_frame_yv12_buf(cm, mbmi->ref_frame[ref]);
      assert(IMPLIES(!is_intrabc_block(mbmi), cfg));
      av1_setup_pre_planes(xd, ref, cfg, mi_row, mi_col,
                           xd->block_ref_scale_factors[ref], num_planes);
    }
    // Predicted sample of inter mode (for Luma plane) cannot be reused if
    // nonrd_check_partition_split speed feature is enabled, Since in such cases
    // the buffer may not contain the predicted sample of best mode.
    const int start_plane =
        (x->reuse_inter_pred && (!cpi->sf.rt_sf.nonrd_check_partition_split) &&
         cm->seq_params->bit_depth == AOM_BITS_8)
            ? 1
            : 0;
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                  start_plane, av1_num_planes(cm) - 1);
    if (mbmi->motion_mode == OBMC_CAUSAL) {
      assert(cpi->oxcf.motion_mode_cfg.enable_obmc);
      av1_build_obmc_inter_predictors_sb(cm, xd);
    }

#if CONFIG_MISMATCH_DEBUG
    if (dry_run == OUTPUT_ENABLED) {
      for (int plane = 0; plane < num_planes; ++plane) {
        const struct macroblockd_plane *pd = &xd->plane[plane];
        int pixel_c, pixel_r;
        mi_to_pixel_loc(&pixel_c, &pixel_r, mi_col, mi_row, 0, 0,
                        pd->subsampling_x, pd->subsampling_y);
        if (!is_chroma_reference(mi_row, mi_col, bsize, pd->subsampling_x,
                                 pd->subsampling_y))
          continue;
        mismatch_record_block_pre(pd->dst.buf, pd->dst.stride,
                                  cm->current_frame.order_hint, plane, pixel_c,
                                  pixel_r, pd->width, pd->height,
                                  xd->cur_buf->flags & YV12_FLAG_HIGHBITDEPTH);
      }
    }
#else
    (void)num_planes;
#endif

    av1_encode_sb(cpi, x, bsize, dry_run);
    av1_tokenize_sb_vartx(cpi, td, dry_run, bsize, rate,
                          tile_data->allow_update_cdf);
  }

  if (!dry_run) {
    if (av1_allow_intrabc(cm) && is_intrabc_block(mbmi)) td->intrabc_used = 1;
    if (txfm_params->tx_mode_search_type == TX_MODE_SELECT &&
        !xd->lossless[mbmi->segment_id] && mbmi->bsize > BLOCK_4X4 &&
        !(is_inter && (mbmi->skip_txfm || seg_skip))) {
      if (is_inter) {
        tx_partition_count_update(cm, x, bsize, td->counts,
                                  tile_data->allow_update_cdf);
      } else {
        if (mbmi->tx_size != max_txsize_rect_lookup[bsize])
          ++x->txfm_search_info.txb_split_count;
        if (block_signals_txsize(bsize)) {
          const int tx_size_ctx = get_tx_size_context(xd);
          const int32_t tx_size_cat = bsize_to_tx_size_cat(bsize);
          const int depth = tx_size_to_depth(mbmi->tx_size, bsize);
          const int max_depths = bsize_to_max_depth(bsize);

          if (tile_data->allow_update_cdf)
            update_cdf(xd->tile_ctx->tx_size_cdf[tx_size_cat][tx_size_ctx],
                       depth, max_depths + 1);
#if CONFIG_ENTROPY_STATS
          ++td->counts->intra_tx_size[tx_size_cat][tx_size_ctx][depth];
#endif
        }
      }
      assert(IMPLIES(is_rect_tx(mbmi->tx_size), is_rect_tx_allowed(xd, mbmi)));
    } else {
      int i, j;
      TX_SIZE intra_tx_size;
      // The new intra coding scheme requires no change of transform size
      if (is_inter) {
        if (xd->lossless[mbmi->segment_id]) {
          intra_tx_size = TX_4X4;
        } else {
          intra_tx_size =
              tx_size_from_tx_mode(bsize, txfm_params->tx_mode_search_type);
        }
      } else {
        intra_tx_size = mbmi->tx_size;
      }

      const int cols = AOMMIN(cm->mi_params.mi_cols - mi_col, mi_width);
      const int rows = AOMMIN(cm->mi_params.mi_rows - mi_row, mi_height);
      for (j = 0; j < rows; j++) {
        for (i = 0; i < cols; i++) mi_4x4[mis * j + i]->tx_size = intra_tx_size;
      }

      if (intra_tx_size != max_txsize_rect_lookup[bsize])
        ++x->txfm_search_info.txb_split_count;
    }
  }

  if (txfm_params->tx_mode_search_type == TX_MODE_SELECT &&
      block_signals_txsize(mbmi->bsize) && is_inter &&
      !(mbmi->skip_txfm || seg_skip) && !xd->lossless[mbmi->segment_id]) {
    if (dry_run) tx_partition_set_contexts(cm, xd, bsize);
  } else {
    TX_SIZE tx_size = mbmi->tx_size;
    // The new intra coding scheme requires no change of transform size
    if (is_inter) {
      if (xd->lossless[mbmi->segment_id]) {
        tx_size = TX_4X4;
      } else {
        tx_size = tx_size_from_tx_mode(bsize, txfm_params->tx_mode_search_type);
      }
    } else {
      tx_size = (bsize > BLOCK_4X4) ? tx_size : TX_4X4;
    }
    mbmi->tx_size = tx_size;
    set_txfm_ctxs(tx_size, xd->width, xd->height,
                  (mbmi->skip_txfm || seg_skip) && is_inter_block(mbmi), xd);
  }

#if !CONFIG_REALTIME_ONLY
  if (is_inter_block(mbmi) && !xd->is_chroma_ref && is_cfl_allowed(xd)) {
    cfl_store_block(xd, mbmi->bsize, mbmi->tx_size);
  }
#endif
  if (!dry_run) {
    if (cpi->oxcf.pass == AOM_RC_ONE_PASS && cpi->svc.temporal_layer_id == 0 &&
        cpi->sf.rt_sf.use_temporal_noise_estimate &&
        (!cpi->ppi->use_svc ||
         (cpi->ppi->use_svc &&
          !cpi->svc.layer_context[cpi->svc.temporal_layer_id].is_key_frame &&
          cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1)))
      update_zeromv_cnt(cpi, mbmi, mi_row, mi_col, bsize);
  }
}